

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O3

void solve_dataflow(gen_ctx_t gen_ctx,int forward_p,_func_void_bb_t *con_func_0,
                   _func_int_gen_ctx_t_bb_t *con_func_n,_func_int_gen_ctx_t_bb_t *trans_func)

{
  MIR_alias_t MVar1;
  MIR_alias_t MVar2;
  void *pvVar3;
  bb_t pbVar4;
  bb_insn_t dst;
  MIR_insn_t pMVar5;
  bitmap_el_t *pbVar6;
  bitmap_t dst_00;
  undefined8 *puVar7;
  long lVar8;
  ulong *puVar9;
  bitmap_t bm;
  uint uVar10;
  int iVar11;
  gen_ctx_t pgVar12;
  gen_ctx_t pgVar13;
  VARR_bb_t *pVVar14;
  ulong uVar15;
  data_flow_ctx *pdVar16;
  bb_insn_t pbVar17;
  bitmap_t pVVar18;
  size_t sVar19;
  VARR_bb_t *pVVar20;
  bb_t_conflict pbVar21;
  bb_insn_t pbVar22;
  bitmap_t pVVar23;
  out_edge_t peVar24;
  in_edge_t_conflict peVar25;
  undefined4 in_register_00000034;
  code *__size;
  __compar_fn_t __compar;
  const_bitmap_t src;
  MIR_op_t *mem2;
  gen_ctx_t pgVar26;
  bitmap_t pVVar27;
  MIR_op_t *nb;
  MIR_op_t *pMVar28;
  MIR_op_t *mem1;
  MIR_insn_t pMVar29;
  ulong uVar30;
  size_t sVar31;
  MIR_insn_t pMVar32;
  ulong uVar33;
  long local_60;
  
  __size = (code *)CONCAT44(in_register_00000034,forward_p);
  pdVar16 = gen_ctx->data_flow_ctx;
  pVVar14 = pdVar16->worklist;
  pgVar26 = gen_ctx;
  if ((pVVar14 == (VARR_bb_t *)0x0) || (pVVar14->varr == (bb_t_conflict *)0x0)) {
LAB_0016588b:
    solve_dataflow_cold_11();
  }
  else {
    pVVar14->els_num = 0;
    pbVar21 = (gen_ctx->curr_cfg->bbs).head;
    if (pbVar21 != (bb_t_conflict)0x0) {
      do {
        pVVar14 = gen_ctx->data_flow_ctx->worklist;
        pgVar12 = (gen_ctx_t)pVVar14->varr;
        if (pgVar12 == (gen_ctx_t)0x0) goto LAB_00165886;
        sVar31 = pVVar14->els_num;
        uVar33 = sVar31 + 1;
        if (pVVar14->size < uVar33) {
          sVar31 = (uVar33 >> 1) + uVar33;
          __size = (code *)(sVar31 * 8);
          pgVar26 = pgVar12;
          pgVar12 = (gen_ctx_t)realloc(pgVar12,(size_t)__size);
          pVVar14->varr = (bb_t_conflict *)pgVar12;
          pVVar14->size = sVar31;
          sVar31 = pVVar14->els_num;
          uVar33 = sVar31 + 1;
        }
        pVVar14->els_num = uVar33;
        pgVar12->call_used_hard_regs[sVar31 - 0xd] = (bitmap_t)pbVar21;
        pbVar21 = (pbVar21->bb_link).next;
      } while (pbVar21 != (bb_t)0x0);
      pdVar16 = gen_ctx->data_flow_ctx;
    }
    pVVar14 = pdVar16->pending;
    if ((pVVar14 != (VARR_bb_t *)0x0) && (pVVar14->varr != (bb_t_conflict *)0x0)) {
      pVVar14->els_num = 0;
      pVVar20 = pdVar16->worklist;
      if (pVVar20 != (VARR_bb_t *)0x0) {
        __size = rpost_cmp;
        local_60 = 0;
        __compar = __size;
        if (forward_p == 0) {
          __size = post_cmp;
          __compar = __size;
        }
        do {
          if (pVVar20->els_num == 0) {
            return;
          }
          if (pVVar14->varr == (bb_t_conflict *)0x0) {
LAB_00165881:
            solve_dataflow_cold_8();
LAB_00165886:
            solve_dataflow_cold_1();
            goto LAB_0016588b;
          }
          pVVar14->els_num = 0;
          pgVar12 = (gen_ctx_t)pVVar20->varr;
          __size = (code *)pVVar20->els_num;
          pgVar26 = pgVar12;
          qsort(pgVar12,(size_t)__size,8,__compar);
          pdVar16 = gen_ctx->data_flow_ctx;
          pVVar23 = pdVar16->bb_to_consider;
          if ((pVVar23 == (bitmap_t)0x0) || (pVVar23->varr == (bitmap_el_t *)0x0)) {
LAB_0016587c:
            solve_dataflow_cold_7();
            goto LAB_00165881;
          }
          pVVar23->els_num = 0;
          pVVar14 = pdVar16->worklist;
          if (pVVar14 == (VARR_bb_t *)0x0) {
LAB_00165877:
            solve_dataflow_cold_6();
            goto LAB_0016587c;
          }
          if (pVVar14->els_num != 0) {
            uVar33 = 0;
            do {
              pgVar13 = (gen_ctx_t)pgVar12->call_used_hard_regs[uVar33 - 0xd];
              if (forward_p == 0) {
                if (((DLIST_out_edge_t *)&pgVar13->addr_regs)->head != (out_edge_t)0x0)
                goto LAB_00165667;
LAB_0016567d:
                pgVar26 = pgVar13;
                (*con_func_0)((bb_t_conflict)pgVar13);
                uVar10 = (uint)(local_60 == 0);
              }
              else {
                if (((DLIST_in_edge_t *)&pgVar13->addr_insn_p)->head == (in_edge_t_conflict)0x0)
                goto LAB_0016567d;
LAB_00165667:
                __size = (code *)pgVar13;
                pgVar26 = gen_ctx;
                uVar10 = (*con_func_n)(gen_ctx,(bb_t_conflict)pgVar13);
                uVar10 = uVar10 | local_60 == 0;
              }
              if ((uVar10 != 0) &&
                 (__size = (code *)pgVar13, pgVar26 = gen_ctx,
                 iVar11 = (*trans_func)(gen_ctx,(bb_t_conflict)pgVar13), iVar11 != 0)) {
                if (forward_p == 0) {
                  for (peVar25 = ((DLIST_in_edge_t *)&pgVar13->addr_insn_p)->head;
                      peVar25 != (in_edge_t_conflict)0x0; peVar25 = (peVar25->in_link).next) {
                    uVar15 = peVar25->src->index;
                    pgVar13 = (gen_ctx_t)gen_ctx->data_flow_ctx->bb_to_consider;
                    __size = (code *)(uVar15 + 1);
                    pgVar26 = pgVar13;
                    bitmap_expand((bitmap_t)pgVar13,(size_t)__size);
                    if (pgVar13 == (gen_ctx_t)0x0) goto LAB_00165868;
                    pvVar3 = (&pgVar13->curr_func_item->data)[uVar15 >> 6];
                    __size = (code *)((ulong)pvVar3 | 1L << (uVar15 & 0x3f));
                    (&pgVar13->curr_func_item->data)[uVar15 >> 6] = __size;
                    if (((ulong)pvVar3 >> (uVar15 & 0x3f) & 1) == 0) {
                      pVVar14 = gen_ctx->data_flow_ctx->pending;
                      pgVar13 = (gen_ctx_t)pVVar14->varr;
                      if (pgVar13 == (gen_ctx_t)0x0) goto LAB_00165872;
                      sVar31 = pVVar14->els_num;
                      pbVar4 = peVar25->src;
                      uVar15 = sVar31 + 1;
                      if (pVVar14->size < uVar15) {
                        sVar31 = (uVar15 >> 1) + uVar15;
                        __size = (code *)(sVar31 * 8);
                        pgVar26 = pgVar13;
                        pgVar13 = (gen_ctx_t)realloc(pgVar13,(size_t)__size);
                        pVVar14->varr = (bb_t_conflict *)pgVar13;
                        pVVar14->size = sVar31;
                        sVar31 = pVVar14->els_num;
                        uVar15 = sVar31 + 1;
                      }
                      pVVar14->els_num = uVar15;
                      pgVar13->call_used_hard_regs[sVar31 - 0xd] = (bitmap_t)pbVar4;
                    }
                  }
                }
                else {
                  for (peVar24 = ((DLIST_out_edge_t *)&pgVar13->addr_regs)->head;
                      peVar24 != (out_edge_t)0x0; peVar24 = (peVar24->out_link).next) {
                    uVar15 = peVar24->dst->index;
                    pgVar13 = (gen_ctx_t)gen_ctx->data_flow_ctx->bb_to_consider;
                    __size = (code *)(uVar15 + 1);
                    pgVar26 = pgVar13;
                    bitmap_expand((bitmap_t)pgVar13,(size_t)__size);
                    if (pgVar13 == (gen_ctx_t)0x0) {
                      solve_dataflow_cold_3();
LAB_00165868:
                      solve_dataflow_cold_5();
LAB_0016586d:
                      solve_dataflow_cold_2();
LAB_00165872:
                      solve_dataflow_cold_4();
                      goto LAB_00165877;
                    }
                    pvVar3 = (&pgVar13->curr_func_item->data)[uVar15 >> 6];
                    __size = (code *)((ulong)pvVar3 | 1L << (uVar15 & 0x3f));
                    (&pgVar13->curr_func_item->data)[uVar15 >> 6] = __size;
                    if (((ulong)pvVar3 >> (uVar15 & 0x3f) & 1) != 0) goto LAB_0016575a;
                    pVVar14 = gen_ctx->data_flow_ctx->pending;
                    pgVar13 = (gen_ctx_t)pVVar14->varr;
                    if (pgVar13 == (gen_ctx_t)0x0) goto LAB_0016586d;
                    sVar31 = pVVar14->els_num;
                    pbVar4 = peVar24->dst;
                    uVar15 = sVar31 + 1;
                    if (pVVar14->size < uVar15) {
                      sVar31 = (uVar15 >> 1) + uVar15;
                      __size = (code *)(sVar31 * 8);
                      pgVar26 = pgVar13;
                      pgVar13 = (gen_ctx_t)realloc(pgVar13,(size_t)__size);
                      pVVar14->varr = (bb_t_conflict *)pgVar13;
                      pVVar14->size = sVar31;
                      sVar31 = pVVar14->els_num;
                      uVar15 = sVar31 + 1;
                    }
                    pVVar14->els_num = uVar15;
                    pgVar13->call_used_hard_regs[sVar31 - 0xd] = (bitmap_t)pbVar4;
LAB_0016575a:
                  }
                }
              }
              pdVar16 = gen_ctx->data_flow_ctx;
              pVVar14 = pdVar16->worklist;
              if (pVVar14 == (VARR_bb_t *)0x0) goto LAB_00165877;
              uVar33 = uVar33 + 1;
            } while (uVar33 < pVVar14->els_num);
          }
          pVVar20 = pdVar16->pending;
          local_60 = local_60 + 1;
          pdVar16->worklist = pVVar20;
          pdVar16->pending = pVVar14;
        } while (pVVar20 != (VARR_bb_t *)0x0);
      }
      solve_dataflow_cold_9();
      return;
    }
  }
  solve_dataflow_cold_10();
  pVVar23 = pgVar26->call_used_hard_regs[0];
  if ((pVVar23 != (bitmap_t)0x0) && (pVVar23->varr != (bitmap_el_t *)0x0)) {
    pVVar23->els_num = 0;
    return;
  }
  mem_av_con_func_0_cold_1();
  dst = ((DLIST_bb_insn_t *)&pgVar26->temp_bitmap)->head;
  bitmap_copy((bitmap_t)dst,((gen_ctx_t)__size)->call_used_hard_regs[0]);
  peVar25 = ((DLIST_in_edge_t *)&((gen_ctx_t)__size)->addr_insn_p)->head;
  pVVar23 = ((gen_ctx_t)__size)->call_used_hard_regs[0];
  src = peVar25->src->out;
  bitmap_copy(pVVar23,src);
  while (peVar25 = (peVar25->in_link).next, peVar25 != (in_edge_t)0x0) {
    src = ((gen_ctx_t)__size)->call_used_hard_regs[0];
    pVVar23 = src;
    bitmap_and(src,src,peVar25->src->out);
  }
  pbVar22 = (bb_insn_t)((gen_ctx_t)__size)->call_used_hard_regs[0];
  if (pbVar22 == (bb_insn_t)0x0) {
    mem_av_con_func_n_cold_2();
  }
  else if (dst != (bb_insn_t)0x0) {
    pMVar32 = pbVar22->insn;
    pMVar5 = dst->insn;
    pbVar17 = dst;
    pMVar29 = pMVar5;
    if (pMVar5 < pMVar32) {
      pbVar17 = pbVar22;
      pbVar22 = dst;
      pMVar29 = pMVar32;
      pMVar32 = pMVar5;
    }
    pbVar6 = *(bitmap_el_t **)&pbVar17->mem_index;
    iVar11 = bcmp(*(bitmap_el_t **)&pbVar22->mem_index,pbVar6,(long)pMVar32 * 8);
    if ((iVar11 == 0) && (pMVar32 < pMVar29)) {
      do {
        if (pbVar6[(long)pMVar32] != 0) {
          return;
        }
        pMVar32 = (MIR_insn_t)((long)&pMVar32->data + 1);
      } while (pMVar29 != pMVar32);
    }
    return;
  }
  mem_av_con_func_n_cold_1();
  dst_00 = (bitmap_t)pVVar23[3].size;
  bitmap_copy(dst_00,(const_bitmap_t)src[4].varr);
  pVVar18 = (bitmap_t)src[4].varr;
  mem2 = (MIR_op_t *)src[5].els_num;
  bitmap_copy(pVVar18,(const_bitmap_t)mem2);
  if ((char)src[4].els_num == '\0') {
    pVVar18 = (bitmap_t)src[4].size;
    pVVar27 = pVVar18;
    if (pVVar18 == (bitmap_t)0x0) goto LAB_00165c05;
    sVar31 = pVVar18->els_num;
    if (sVar31 != 0) {
      sVar19 = 0;
      nb = (MIR_op_t *)0x0;
      do {
        while ((mem2 = (MIR_op_t *)pVVar18->varr[sVar19], mem2 == (MIR_op_t *)0x0 ||
               (mem2 = (MIR_op_t *)((ulong)mem2 >> ((ulong)nb & 0x3f)), mem2 == (MIR_op_t *)0x0))) {
          sVar19 = sVar19 + 1;
          nb = (MIR_op_t *)(sVar19 * 0x40);
          if (sVar31 == sVar19) goto LAB_001659ab;
        }
        uVar33 = (ulong)mem2 & 1;
        pMVar28 = nb;
        while (uVar33 == 0) {
          pMVar28 = (MIR_op_t *)((long)&pMVar28->data + 1);
          uVar33 = (ulong)mem2 & 2;
          mem2 = (MIR_op_t *)((ulong)mem2 >> 1);
        }
        puVar7 = *(undefined8 **)(pVVar23[0xe].els_num + 0x10);
        if (((puVar7 == (undefined8 *)0x0) || (puVar7[2] == 0)) || ((MIR_op_t *)*puVar7 <= pMVar28))
        goto LAB_00165c00;
        pVVar27 = (bitmap_t)src[5].els_num;
        lVar8 = **(long **)(puVar7[2] + (long)pMVar28 * 8);
        mem1 = (MIR_op_t *)(lVar8 + 0x50);
        if (*(char *)(lVar8 + 0x28) == '\v') {
          mem1 = (MIR_op_t *)(lVar8 + 0x20);
        }
        if (pVVar27 == (bitmap_t)0x0) goto LAB_00165c0f;
        sVar31 = pVVar27->els_num;
        nb = (MIR_op_t *)((long)&pMVar28->data + 1);
        if (sVar31 != 0) {
          sVar19 = 0;
          uVar33 = 0;
          do {
            while ((pVVar27->varr[sVar19] == 0 ||
                   (mem2 = (MIR_op_t *)(pVVar27->varr[sVar19] >> (uVar33 & 0x3f)),
                   mem2 == (MIR_op_t *)0x0))) {
              sVar19 = sVar19 + 1;
              uVar33 = sVar19 * 0x40;
              if (sVar31 == sVar19) goto LAB_00165ba6;
            }
            uVar15 = (ulong)mem2 & 1;
            while (uVar15 == 0) {
              uVar33 = uVar33 + 1;
              uVar15 = (ulong)mem2 & 2;
              mem2 = (MIR_op_t *)((ulong)mem2 >> 1);
            }
            puVar9 = *(ulong **)(pVVar23[0xe].els_num + 0x10);
            if (((puVar9 == (ulong *)0x0) || (puVar9[2] == 0)) || (*puVar9 <= uVar33))
            goto LAB_00165c0a;
            lVar8 = **(long **)(puVar9[2] + uVar33 * 8);
            if (*(char *)(lVar8 + 0x28) == '\v') {
              mem2 = (MIR_op_t *)(lVar8 + 0x20);
              iVar11 = may_mem_alias_p(mem1,mem2);
              if (iVar11 != 0) goto LAB_00165bd9;
            }
            sVar31 = pVVar27->els_num;
            uVar33 = uVar33 + 1;
            sVar19 = uVar33 >> 6;
          } while (sVar19 < sVar31);
        }
LAB_00165ba6:
        bm = (bitmap_t)src[4].varr;
        mem2 = nb;
        pVVar27 = bm;
        bitmap_expand(bm,(size_t)nb);
        if (bm == (bitmap_t)0x0) goto LAB_00165c14;
        bm->varr[(ulong)pMVar28 >> 6] =
             bm->varr[(ulong)pMVar28 >> 6] | 1L << ((ulong)pMVar28 & 0x3f);
LAB_00165bd9:
        sVar19 = (ulong)nb >> 6;
        sVar31 = pVVar18->els_num;
      } while (sVar19 < sVar31);
    }
  }
LAB_001659ab:
  pVVar23 = (bitmap_t)src[4].varr;
  if (pVVar23 == (bitmap_t)0x0) {
    mem_av_trans_func_cold_6();
  }
  else if (dst_00 != (bitmap_t)0x0) {
    uVar33 = pVVar23->els_num;
    uVar15 = dst_00->els_num;
    pVVar18 = dst_00;
    uVar30 = uVar15;
    if (uVar15 < uVar33) {
      pVVar18 = pVVar23;
      pVVar23 = dst_00;
      uVar30 = uVar33;
      uVar33 = uVar15;
    }
    pbVar6 = pVVar18->varr;
    iVar11 = bcmp(pVVar23->varr,pbVar6,uVar33 * 8);
    if ((iVar11 == 0) && (uVar33 < uVar30)) {
      do {
        if (pbVar6[uVar33] != 0) {
          return;
        }
        uVar33 = uVar33 + 1;
      } while (uVar30 != uVar33);
    }
    return;
  }
  mem_av_trans_func_cold_5();
LAB_00165c00:
  mem_av_trans_func_cold_4();
  pVVar27 = pVVar18;
LAB_00165c05:
  mem_av_trans_func_cold_7();
LAB_00165c0a:
  mem_av_trans_func_cold_1();
LAB_00165c0f:
  mem_av_trans_func_cold_3();
LAB_00165c14:
  mem_av_trans_func_cold_2();
  if (((char)pVVar27->size != '\v') || ((char)*(size_t *)&mem2->field_0x8 != '\v')) {
    __assert_fail("mem1->mode == MIR_OP_VAR_MEM && mem2->mode == MIR_OP_VAR_MEM",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0xd72,"int may_mem_alias_p(const MIR_op_t *, const MIR_op_t *)");
  }
  MVar1 = *(MIR_alias_t *)((long)&pVVar27->varr + 4);
  MVar2 = (mem2->u).mem.alias;
  if ((((MVar1 == MVar2) || (MVar1 == 0)) || (MVar2 == 0)) &&
     (*(int *)((long)&mem2->u + 8) != 0 && (int)pVVar27[1].els_num != 0)) {
    return;
  }
  return;
}

Assistant:

static void solve_dataflow (gen_ctx_t gen_ctx, int forward_p, void (*con_func_0) (bb_t),
                            int (*con_func_n) (gen_ctx_t, bb_t),
                            int (*trans_func) (gen_ctx_t, bb_t)) {
  size_t i, iter;
  bb_t bb, *addr;
  VARR (bb_t) * t;

  VARR_TRUNC (bb_t, worklist, 0);
  for (bb = DLIST_HEAD (bb_t, curr_cfg->bbs); bb != NULL; bb = DLIST_NEXT (bb_t, bb))
    VARR_PUSH (bb_t, worklist, bb);
  VARR_TRUNC (bb_t, pending, 0);
  iter = 0;
  while (VARR_LENGTH (bb_t, worklist) != 0) {
    VARR_TRUNC (bb_t, pending, 0);
    addr = VARR_ADDR (bb_t, worklist);
    qsort (addr, VARR_LENGTH (bb_t, worklist), sizeof (bb), forward_p ? rpost_cmp : post_cmp);
    bitmap_clear (bb_to_consider);
    for (i = 0; i < VARR_LENGTH (bb_t, worklist); i++) {
      int changed_p = iter == 0;
      edge_t e;

      bb = addr[i];
      if (forward_p) {
        if (DLIST_HEAD (in_edge_t, bb->in_edges) == NULL)
          con_func_0 (bb);
        else
          changed_p |= con_func_n (gen_ctx, bb);
      } else {
        if (DLIST_HEAD (out_edge_t, bb->out_edges) == NULL)
          con_func_0 (bb);
        else
          changed_p |= con_func_n (gen_ctx, bb);
      }
      if (changed_p && trans_func (gen_ctx, bb)) {
        if (forward_p) {
          for (e = DLIST_HEAD (out_edge_t, bb->out_edges); e != NULL;
               e = DLIST_NEXT (out_edge_t, e))
            if (bitmap_set_bit_p (bb_to_consider, e->dst->index)) VARR_PUSH (bb_t, pending, e->dst);
        } else {
          for (e = DLIST_HEAD (in_edge_t, bb->in_edges); e != NULL; e = DLIST_NEXT (in_edge_t, e))
            if (bitmap_set_bit_p (bb_to_consider, e->src->index)) VARR_PUSH (bb_t, pending, e->src);
        }
      }
    }
    iter++;
    t = worklist;
    worklist = pending;
    pending = t;
  }
}